

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void on_fatal_error(int from_program)

{
  undefined4 unaff_retaddr;
  
  free_rom();
  free_map();
  list_free((list_t *)CONCAT44(from_program,unaff_retaddr));
  list_free((list_t *)CONCAT44(from_program,unaff_retaddr));
  list_free((list_t *)CONCAT44(from_program,unaff_retaddr));
  list_free((list_t *)CONCAT44(from_program,unaff_retaddr));
  exit(1);
}

Assistant:

void on_fatal_error(int from_program)
{
    free_rom();
    free_map();
    list_free(lfiles);
    list_free(lsections);
    list_free(lsymbols);
    list_free(lrelocations);
    exit(EXIT_FAILURE);
}